

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  int *iStart;
  BYTE *pBVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  BYTE *pBVar8;
  uint uVar9;
  BYTE *pBVar10;
  ZSTD_matchState_t *pZVar11;
  BYTE *pBVar12;
  ulong *mEnd;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  U32 *pUVar16;
  seqDef *psVar17;
  bool bVar18;
  uint uVar19;
  undefined8 uVar20;
  uint uVar21;
  int iVar22;
  ulong *puVar23;
  seqDef **ppsVar24;
  BYTE *pBVar25;
  size_t sVar26;
  int *piVar27;
  BYTE *pBVar28;
  int *piVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  U32 UVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ulong *puVar37;
  uint uVar38;
  BYTE *litEnd;
  BYTE *litEnd_1;
  int *piVar39;
  ulong *puVar40;
  ulong *puVar41;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar47;
  int iVar48;
  ulong uVar49;
  int iVar50;
  ulong *puVar51;
  U32 UVar52;
  ulong *puVar53;
  uint uVar54;
  BYTE *litEnd_6;
  BYTE *unaff_R15;
  U32 prefixLowestIndex;
  BYTE *ilimit;
  BYTE *litLimit_w;
  BYTE *base;
  BYTE *iend;
  BYTE *prefixLowest;
  BYTE *litLimit_w_6;
  U32 dictStartIndex;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *dictEnd;
  BYTE *dictStart;
  U32 *hashLong;
  U32 *hashSmall;
  U32 *dictHashLong;
  U32 *dictHashSmall;
  U32 local_138;
  U32 local_134;
  BYTE *local_120;
  BYTE *local_118;
  BYTE *local_100;
  BYTE *local_b8;
  uint local_90;
  ulong uVar46;
  
  pBVar10 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar48 = (int)pBVar10;
  iVar50 = (int)iEnd - iVar48;
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar9 = (ms->window).dictLimit;
  uVar19 = iVar50 - uVar21;
  if (iVar50 - uVar9 <= uVar21) {
    uVar19 = uVar9;
  }
  if (ms->loadedDictEnd != 0) {
    uVar19 = uVar9;
  }
  iStart = (int *)(pBVar10 + uVar19);
  pZVar11 = ms->dictMatchState;
  uVar9 = (pZVar11->window).dictLimit;
  pBVar12 = (pZVar11->window).base;
  piVar39 = (int *)(pBVar12 + uVar9);
  mEnd = (ulong *)(pZVar11->window).nextSrc;
  uVar45 = ((int)pBVar12 - (int)mEnd) + uVar19;
  uVar46 = (ulong)uVar45;
  puVar7 = (ulong *)((long)src + (srcSize - 8));
  puVar53 = (ulong *)((ulong)(((int)src - ((int)iStart + (int)piVar39)) + (int)mEnd == 0) +
                     (long)src);
  uVar21 = (ms->cParams).minMatch;
  pUVar13 = ms->hashTable;
  pUVar14 = ms->chainTable;
  local_134 = *rep;
  local_138 = rep[1];
  pUVar15 = pZVar11->hashTable;
  pUVar16 = pZVar11->chainTable;
  if (uVar21 == 5) {
    if (puVar53 < puVar7) {
      bVar30 = 0x40 - (char)(ms->cParams).hashLog;
      bVar31 = 0x40 - (char)(ms->cParams).chainLog;
      bVar32 = 0x40 - (char)(pZVar11->cParams).hashLog;
      uVar21 = (pZVar11->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar23 = iEnd + -4;
      ppsVar24 = &seqStore->sequences;
      pBVar25 = pBVar10 + -1;
      local_100 = pBVar25;
LAB_00604dee:
      uVar36 = *puVar53;
      uVar44 = uVar36 * -0x30e44323485a9b9d >> (bVar30 & 0x3f);
      uVar47 = uVar36 * -0x30e4432345000000 >> (bVar31 & 0x3f);
      UVar52 = (int)puVar53 - iVar48;
      uVar38 = pUVar13[uVar44];
      UVar33 = UVar52 + 1;
      uVar34 = UVar33 - local_134;
      piVar27 = (int *)(pBVar10 + uVar34);
      if (uVar34 < uVar19) {
        piVar27 = (int *)(pBVar12 + (uVar34 - uVar45));
      }
      local_90 = pUVar14[uVar47];
      pUVar14[uVar47] = UVar52;
      pUVar13[uVar44] = UVar52;
      if ((uVar34 - uVar19 < 0xfffffffd) && (*piVar27 == *(int *)((long)puVar53 + 1))) {
        puVar37 = (ulong *)((long)puVar53 + 1);
        puVar51 = iEnd;
        if (uVar34 < uVar19) {
          puVar51 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar27 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar51,(BYTE *)iStart);
        uVar36 = (long)puVar37 - (long)src;
        if (puVar23 < puVar37) {
          puVar51 = (ulong *)seqStore->lit;
          puVar53 = puVar51;
          puVar40 = (ulong *)src;
          if (src <= puVar23) {
            puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
            uVar44 = *(ulong *)((long)src + 8);
            *puVar51 = *src;
            puVar51[1] = uVar44;
            puVar40 = puVar23;
            if (0x10 < (long)puVar23 - (long)src) {
              lVar42 = 0x10;
              do {
                uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
                puVar5 = (undefined8 *)((long)puVar51 + lVar42);
                *puVar5 = *(undefined8 *)((long)src + lVar42);
                puVar5[1] = uVar20;
                pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
                uVar20 = *(undefined8 *)(pBVar28 + 8);
                puVar5[2] = *(undefined8 *)pBVar28;
                puVar5[3] = uVar20;
                lVar42 = lVar42 + 0x20;
              } while (puVar5 + 4 < puVar53);
            }
          }
          if (puVar40 < puVar37) {
            lVar42 = 0;
            do {
              *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
              lVar42 = lVar42 + 1;
            } while ((long)puVar37 - (long)puVar40 != lVar42);
          }
        }
        else {
          puVar53 = (ulong *)seqStore->lit;
          uVar44 = *(ulong *)((long)src + 8);
          *puVar53 = *src;
          puVar53[1] = uVar44;
          if (0x10 < uVar36) {
            pBVar28 = seqStore->lit;
            uVar44 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar28 + 0x18) = uVar44;
            if (0x20 < (long)uVar36) {
              lVar42 = 0;
              do {
                pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
                uVar20 = *(undefined8 *)(pBVar8 + 8);
                pBVar4 = pBVar28 + lVar42 + 0x20;
                *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar4 + 8) = uVar20;
                pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
                uVar20 = *(undefined8 *)(pBVar8 + 8);
                *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar4 + 0x18) = uVar20;
                lVar42 = lVar42 + 0x20;
              } while (pBVar4 + 0x20 < pBVar28 + uVar36);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        local_118 = (BYTE *)(sVar26 + 4);
        pBVar28 = (BYTE *)(sVar26 + 1);
        psVar17 = *ppsVar24;
        psVar17->litLength = (U16)uVar36;
        psVar17->offset = 1;
        goto joined_r0x006052b5;
      }
      if (uVar19 < uVar38) {
        puVar37 = (ulong *)(pBVar10 + uVar38);
        if (*puVar37 == uVar36) {
          puVar51 = puVar53 + 1;
          puVar41 = puVar37 + 1;
          puVar40 = puVar51;
          if (puVar51 < puVar1) {
            uVar44 = *puVar51 ^ *puVar41;
            uVar36 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
            if (*puVar41 == *puVar51) {
              puVar40 = puVar53 + 2;
              puVar41 = puVar37 + 2;
              do {
                if (puVar1 <= puVar40) goto LAB_00605145;
                uVar36 = *puVar41;
                uVar44 = *puVar40;
                uVar49 = uVar44 ^ uVar36;
                uVar47 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51));
                puVar40 = puVar40 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar36 == uVar44);
            }
          }
          else {
LAB_00605145:
            if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar40 < iEnd) {
              puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
            }
            pBVar28 = (BYTE *)((long)puVar40 - (long)puVar51);
          }
          local_118 = pBVar28 + 8;
          local_100 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar37);
          puVar37 = puVar53;
          if ((uVar19 < uVar38) && (src < puVar53)) {
            piVar27 = (int *)(pBVar25 + uVar38);
            do {
              puVar51 = (ulong *)((long)puVar53 + -1);
              puVar37 = puVar53;
              if ((*(BYTE *)puVar51 != (BYTE)*piVar27) ||
                 (local_118 = local_118 + 1, puVar37 = puVar51, piVar27 <= iStart)) break;
              piVar27 = (int *)((long)piVar27 + -1);
              puVar53 = puVar51;
            } while (src < puVar51);
          }
          goto LAB_006055f8;
        }
LAB_006052e4:
        if (uVar19 < local_90) {
          piVar27 = (int *)(pBVar10 + local_90);
          if (*piVar27 != (int)*puVar53) {
LAB_00605338:
            puVar53 = (ulong *)((long)puVar53 + ((long)puVar53 - (long)src >> 8) + 1);
            goto LAB_00605940;
          }
        }
        else {
          local_90 = pUVar16[uVar36 * -0x30e4432345000000 >> (0x40U - (char)uVar21 & 0x3f)];
          piVar27 = (int *)(pBVar12 + local_90);
          if ((local_90 <= uVar9) || (iVar50 = 10, *piVar27 != (int)*puVar53)) {
            iVar50 = 0;
          }
          if (iVar50 != 10) {
            if (iVar50 != 0) goto LAB_00605940;
            goto LAB_00605338;
          }
          local_90 = local_90 + uVar45;
        }
        lVar42 = *(long *)((long)puVar53 + 1);
        uVar36 = (ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar30 & 0x3f);
        puVar37 = (ulong *)((long)puVar53 + 1);
        uVar38 = pUVar13[uVar36];
        pUVar13[uVar36] = UVar33;
        if (uVar19 < uVar38) {
          plVar6 = (long *)(pBVar10 + uVar38);
          if (*plVar6 == lVar42) {
            puVar51 = (ulong *)((long)puVar53 + 9);
            puVar41 = (ulong *)(plVar6 + 1);
            puVar40 = puVar51;
            if (puVar51 < puVar1) {
              uVar44 = *puVar51 ^ *puVar41;
              uVar36 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              local_118 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
              if (*puVar41 == *puVar51) {
                puVar40 = (ulong *)((long)puVar53 + 0x11);
                puVar41 = (ulong *)(plVar6 + 2);
                do {
                  if (puVar1 <= puVar40) goto LAB_006059cb;
                  uVar36 = *puVar41;
                  uVar44 = *puVar40;
                  uVar49 = uVar44 ^ uVar36;
                  uVar47 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  local_118 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51))
                  ;
                  puVar40 = puVar40 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar36 == uVar44);
              }
            }
            else {
LAB_006059cb:
              if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                puVar40 = (ulong *)((long)puVar40 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                puVar40 = (ulong *)((long)puVar40 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar40 < iEnd) {
                puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
              }
              local_118 = (BYTE *)((long)puVar40 - (long)puVar51);
            }
            local_118 = local_118 + 8;
            uVar34 = (int)puVar37 - (int)plVar6;
            iVar50 = 7;
            if (uVar19 < uVar38) {
              if (src < puVar37) {
                piVar29 = (int *)(pBVar25 + uVar38);
                do {
                  if ((BYTE)*puVar53 != (BYTE)*piVar29) goto LAB_00605a79;
                  local_118 = local_118 + 1;
                  puVar37 = puVar53;
                  iVar50 = 7;
                } while ((iStart < piVar29) &&
                        (piVar29 = (int *)((long)piVar29 + -1), bVar18 = src < puVar53,
                        puVar53 = (ulong *)((long)puVar53 + -1), bVar18));
              }
              else {
LAB_00605a81:
                iVar50 = 7;
              }
            }
          }
          else {
LAB_00605517:
            iVar50 = 0;
            uVar34 = (uint)local_100;
            puVar37 = puVar53;
          }
        }
        else {
          uVar38 = pUVar15[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar32 & 0x3f)];
          if ((uVar38 <= uVar9) || (*(long *)(pBVar12 + uVar38) != lVar42)) goto LAB_00605517;
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar53 + 9),(BYTE *)((long)(pBVar12 + uVar38) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          local_118 = (BYTE *)(sVar26 + 8);
          uVar34 = UVar33 - (uVar45 + uVar38);
          iVar50 = 7;
          if (uVar9 < uVar38) {
            if (puVar37 <= src) goto LAB_00605a81;
            piVar29 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
            do {
              if ((BYTE)*puVar53 != (BYTE)*piVar29) goto LAB_00605a79;
              local_118 = local_118 + 1;
              puVar37 = puVar53;
              iVar50 = 7;
            } while ((piVar39 < piVar29) &&
                    (piVar29 = (int *)((long)piVar29 + -1), bVar18 = src < puVar53,
                    puVar53 = (ulong *)((long)puVar53 + -1), bVar18));
          }
        }
        goto LAB_00605524;
      }
      uVar38 = pUVar15[uVar36 * -0x30e44323485a9b9d >> (bVar32 & 0x3f)];
      iVar50 = 0;
      if ((uVar9 < uVar38) && (*(ulong *)(pBVar12 + uVar38) == uVar36)) {
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar38) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        local_118 = (BYTE *)(sVar26 + 8);
        local_100 = (BYTE *)(ulong)(UVar52 - (uVar45 + uVar38));
        iVar22 = 7;
        iVar50 = 7;
        if ((uVar9 < uVar38) && (iVar50 = iVar22, src < puVar53)) {
          piVar27 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
          do {
            puVar37 = (ulong *)((long)puVar53 + -1);
            if ((*(BYTE *)puVar37 != (BYTE)*piVar27) ||
               (local_118 = local_118 + 1, puVar53 = puVar37, piVar27 <= piVar39)) break;
            piVar27 = (int *)((long)piVar27 + -1);
          } while (src < puVar37);
        }
      }
      puVar37 = puVar53;
      if (iVar50 == 7) goto LAB_006055f8;
      if (iVar50 == 0) goto LAB_006052e4;
      goto LAB_00605940;
    }
  }
  else if (uVar21 == 6) {
    if (puVar53 < puVar7) {
      bVar30 = 0x40 - (char)(ms->cParams).hashLog;
      bVar31 = 0x40 - (char)(ms->cParams).chainLog;
      bVar32 = 0x40 - (char)(pZVar11->cParams).hashLog;
      uVar21 = (pZVar11->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar23 = iEnd + -4;
      ppsVar24 = &seqStore->sequences;
      pBVar25 = pBVar10 + -1;
      local_100 = pBVar25;
LAB_00603f5b:
      uVar36 = *puVar53;
      uVar44 = uVar36 * -0x30e44323485a9b9d >> (bVar30 & 0x3f);
      uVar47 = uVar36 * -0x30e4432340650000 >> (bVar31 & 0x3f);
      UVar52 = (int)puVar53 - iVar48;
      uVar38 = pUVar13[uVar44];
      UVar33 = UVar52 + 1;
      uVar34 = UVar33 - local_134;
      piVar27 = (int *)(pBVar10 + uVar34);
      if (uVar34 < uVar19) {
        piVar27 = (int *)(pBVar12 + (uVar34 - uVar45));
      }
      local_90 = pUVar14[uVar47];
      pUVar14[uVar47] = UVar52;
      pUVar13[uVar44] = UVar52;
      if ((uVar34 - uVar19 < 0xfffffffd) && (*piVar27 == *(int *)((long)puVar53 + 1))) {
        puVar37 = (ulong *)((long)puVar53 + 1);
        puVar51 = iEnd;
        if (uVar34 < uVar19) {
          puVar51 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar27 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar51,(BYTE *)iStart);
        uVar36 = (long)puVar37 - (long)src;
        if (puVar23 < puVar37) {
          puVar51 = (ulong *)seqStore->lit;
          puVar53 = puVar51;
          puVar40 = (ulong *)src;
          if (src <= puVar23) {
            puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
            uVar44 = *(ulong *)((long)src + 8);
            *puVar51 = *src;
            puVar51[1] = uVar44;
            puVar40 = puVar23;
            if (0x10 < (long)puVar23 - (long)src) {
              lVar42 = 0x10;
              do {
                uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
                puVar5 = (undefined8 *)((long)puVar51 + lVar42);
                *puVar5 = *(undefined8 *)((long)src + lVar42);
                puVar5[1] = uVar20;
                pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
                uVar20 = *(undefined8 *)(pBVar28 + 8);
                puVar5[2] = *(undefined8 *)pBVar28;
                puVar5[3] = uVar20;
                lVar42 = lVar42 + 0x20;
              } while (puVar5 + 4 < puVar53);
            }
          }
          if (puVar40 < puVar37) {
            lVar42 = 0;
            do {
              *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
              lVar42 = lVar42 + 1;
            } while ((long)puVar37 - (long)puVar40 != lVar42);
          }
        }
        else {
          puVar53 = (ulong *)seqStore->lit;
          uVar44 = *(ulong *)((long)src + 8);
          *puVar53 = *src;
          puVar53[1] = uVar44;
          if (0x10 < uVar36) {
            pBVar28 = seqStore->lit;
            uVar44 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar28 + 0x18) = uVar44;
            if (0x20 < (long)uVar36) {
              lVar42 = 0;
              do {
                pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
                uVar20 = *(undefined8 *)(pBVar8 + 8);
                pBVar4 = pBVar28 + lVar42 + 0x20;
                *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar4 + 8) = uVar20;
                pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
                uVar20 = *(undefined8 *)(pBVar8 + 8);
                *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar4 + 0x18) = uVar20;
                lVar42 = lVar42 + 0x20;
              } while (pBVar4 + 0x20 < pBVar28 + uVar36);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        local_120 = (BYTE *)(sVar26 + 4);
        pBVar28 = (BYTE *)(sVar26 + 1);
        psVar17 = *ppsVar24;
        psVar17->litLength = (U16)uVar36;
        psVar17->offset = 1;
        goto joined_r0x00604434;
      }
      if (uVar19 < uVar38) {
        puVar37 = (ulong *)(pBVar10 + uVar38);
        if (*puVar37 == uVar36) {
          puVar51 = puVar53 + 1;
          puVar41 = puVar37 + 1;
          puVar40 = puVar51;
          if (puVar51 < puVar1) {
            uVar44 = *puVar51 ^ *puVar41;
            uVar36 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
            if (*puVar41 == *puVar51) {
              puVar40 = puVar53 + 2;
              puVar41 = puVar37 + 2;
              do {
                if (puVar1 <= puVar40) goto LAB_006042b2;
                uVar36 = *puVar41;
                uVar44 = *puVar40;
                uVar49 = uVar44 ^ uVar36;
                uVar47 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51));
                puVar40 = puVar40 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar36 == uVar44);
            }
          }
          else {
LAB_006042b2:
            if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar40 < iEnd) {
              puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
            }
            pBVar28 = (BYTE *)((long)puVar40 - (long)puVar51);
          }
          local_120 = pBVar28 + 8;
          local_100 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar37);
          puVar37 = puVar53;
          if ((uVar19 < uVar38) && (src < puVar53)) {
            piVar27 = (int *)(pBVar25 + uVar38);
            do {
              puVar51 = (ulong *)((long)puVar53 + -1);
              puVar37 = puVar53;
              if ((*(BYTE *)puVar51 != (BYTE)*piVar27) ||
                 (local_120 = local_120 + 1, puVar37 = puVar51, piVar27 <= iStart)) break;
              piVar27 = (int *)((long)piVar27 + -1);
              puVar53 = puVar51;
            } while (src < puVar51);
          }
          goto LAB_0060477a;
        }
LAB_0060445f:
        if (uVar19 < local_90) {
          piVar27 = (int *)(pBVar10 + local_90);
          if (*piVar27 != (int)*puVar53) {
LAB_006044b1:
            puVar53 = (ulong *)((long)puVar53 + ((long)puVar53 - (long)src >> 8) + 1);
            goto LAB_00604ab7;
          }
        }
        else {
          local_90 = pUVar16[uVar36 * -0x30e4432340650000 >> (0x40U - (char)uVar21 & 0x3f)];
          piVar27 = (int *)(pBVar12 + local_90);
          if ((local_90 <= uVar9) || (iVar50 = 10, *piVar27 != (int)*puVar53)) {
            iVar50 = 0;
          }
          if (iVar50 != 10) {
            if (iVar50 != 0) goto LAB_00604ab7;
            goto LAB_006044b1;
          }
          local_90 = local_90 + uVar45;
        }
        lVar42 = *(long *)((long)puVar53 + 1);
        uVar36 = (ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar30 & 0x3f);
        puVar37 = (ulong *)((long)puVar53 + 1);
        uVar38 = pUVar13[uVar36];
        pUVar13[uVar36] = UVar33;
        if (uVar19 < uVar38) {
          plVar6 = (long *)(pBVar10 + uVar38);
          if (*plVar6 == lVar42) {
            puVar51 = (ulong *)((long)puVar53 + 9);
            puVar41 = (ulong *)(plVar6 + 1);
            puVar40 = puVar51;
            if (puVar51 < puVar1) {
              uVar44 = *puVar51 ^ *puVar41;
              uVar36 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
              if (*puVar41 == *puVar51) {
                puVar40 = (ulong *)((long)puVar53 + 0x11);
                puVar41 = (ulong *)(plVar6 + 2);
                do {
                  if (puVar1 <= puVar40) goto LAB_00604b4d;
                  uVar36 = *puVar41;
                  uVar44 = *puVar40;
                  uVar49 = uVar44 ^ uVar36;
                  uVar47 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51));
                  puVar40 = puVar40 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar36 == uVar44);
              }
            }
            else {
LAB_00604b4d:
              if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                puVar40 = (ulong *)((long)puVar40 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                puVar40 = (ulong *)((long)puVar40 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar40 < iEnd) {
                puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
              }
              pBVar28 = (BYTE *)((long)puVar40 - (long)puVar51);
            }
            local_120 = pBVar28 + 8;
            local_100 = (BYTE *)(ulong)(uint)((int)puVar37 - (int)plVar6);
            iVar50 = 7;
            iVar22 = 7;
            if ((uVar19 < uVar38) && (iVar50 = iVar22, src < puVar37)) {
              piVar29 = (int *)(pBVar25 + uVar38);
              do {
                if ((BYTE)*puVar53 != (BYTE)*piVar29) goto LAB_00604bf8;
                local_120 = local_120 + 1;
                puVar37 = puVar53;
              } while ((iStart < piVar29) &&
                      (piVar29 = (int *)((long)piVar29 + -1), bVar18 = src < puVar53,
                      puVar53 = (ulong *)((long)puVar53 + -1), bVar18));
            }
          }
          else {
LAB_00604698:
            iVar50 = 0;
            local_100 = (BYTE *)((ulong)local_100 & 0xffffffff);
            puVar37 = puVar53;
          }
        }
        else {
          uVar38 = pUVar15[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar32 & 0x3f)];
          if ((uVar38 <= uVar9) || (*(long *)(pBVar12 + uVar38) != lVar42)) goto LAB_00604698;
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar53 + 9),(BYTE *)((long)(pBVar12 + uVar38) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          local_120 = (BYTE *)(sVar26 + 8);
          local_100 = (BYTE *)(ulong)(UVar33 - (uVar45 + uVar38));
          iVar50 = 7;
          iVar22 = 7;
          if ((uVar9 < uVar38) && (iVar50 = iVar22, src < puVar37)) {
            piVar29 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
            do {
              if ((BYTE)*puVar53 != (BYTE)*piVar29) goto LAB_00604bf8;
              local_120 = local_120 + 1;
              puVar37 = puVar53;
            } while ((piVar39 < piVar29) &&
                    (piVar29 = (int *)((long)piVar29 + -1), bVar18 = src < puVar53,
                    puVar53 = (ulong *)((long)puVar53 + -1), bVar18));
          }
        }
        goto LAB_006046a4;
      }
      uVar38 = pUVar15[uVar36 * -0x30e44323485a9b9d >> (bVar32 & 0x3f)];
      iVar50 = 0;
      if ((uVar9 < uVar38) && (*(ulong *)(pBVar12 + uVar38) == uVar36)) {
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar38) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        local_120 = (BYTE *)(sVar26 + 8);
        local_100 = (BYTE *)(ulong)(UVar52 - (uVar45 + uVar38));
        iVar22 = 7;
        iVar50 = 7;
        if ((uVar9 < uVar38) && (iVar50 = iVar22, src < puVar53)) {
          piVar27 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
          do {
            puVar37 = (ulong *)((long)puVar53 + -1);
            if ((*(BYTE *)puVar37 != (BYTE)*piVar27) ||
               (local_120 = local_120 + 1, puVar53 = puVar37, piVar27 <= piVar39)) break;
            piVar27 = (int *)((long)piVar27 + -1);
          } while (src < puVar37);
        }
      }
      puVar37 = puVar53;
      if (iVar50 == 7) goto LAB_0060477a;
      if (iVar50 == 0) goto LAB_0060445f;
      goto LAB_00604ab7;
    }
  }
  else if (uVar21 == 7) {
    if (puVar53 < puVar7) {
      bVar30 = 0x40 - (char)(ms->cParams).hashLog;
      bVar31 = 0x40 - (char)(ms->cParams).chainLog;
      bVar32 = 0x40 - (char)(pZVar11->cParams).hashLog;
      uVar21 = (pZVar11->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar23 = iEnd + -4;
      ppsVar24 = &seqStore->sequences;
      pBVar25 = pBVar10 + -1;
      local_100 = pBVar25;
LAB_00603103:
      uVar36 = *puVar53;
      uVar44 = uVar36 * -0x30e44323485a9b9d >> (bVar30 & 0x3f);
      uVar47 = uVar36 * -0x30e44323405a9d00 >> (bVar31 & 0x3f);
      UVar52 = (int)puVar53 - iVar48;
      uVar38 = pUVar13[uVar44];
      UVar33 = UVar52 + 1;
      uVar34 = UVar33 - local_134;
      piVar27 = (int *)(pBVar10 + uVar34);
      if (uVar34 < uVar19) {
        piVar27 = (int *)(pBVar12 + (uVar34 - uVar45));
      }
      local_90 = pUVar14[uVar47];
      pUVar14[uVar47] = UVar52;
      pUVar13[uVar44] = UVar52;
      if ((uVar34 - uVar19 < 0xfffffffd) && (*piVar27 == *(int *)((long)puVar53 + 1))) {
        puVar37 = (ulong *)((long)puVar53 + 1);
        puVar51 = iEnd;
        if (uVar34 < uVar19) {
          puVar51 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar27 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar51,(BYTE *)iStart);
        uVar36 = (long)puVar37 - (long)src;
        if (puVar23 < puVar37) {
          puVar51 = (ulong *)seqStore->lit;
          puVar53 = puVar51;
          puVar40 = (ulong *)src;
          if (src <= puVar23) {
            puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
            uVar44 = *(ulong *)((long)src + 8);
            *puVar51 = *src;
            puVar51[1] = uVar44;
            puVar40 = puVar23;
            if (0x10 < (long)puVar23 - (long)src) {
              lVar42 = 0x10;
              do {
                uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
                puVar5 = (undefined8 *)((long)puVar51 + lVar42);
                *puVar5 = *(undefined8 *)((long)src + lVar42);
                puVar5[1] = uVar20;
                pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
                uVar20 = *(undefined8 *)(pBVar28 + 8);
                puVar5[2] = *(undefined8 *)pBVar28;
                puVar5[3] = uVar20;
                lVar42 = lVar42 + 0x20;
              } while (puVar5 + 4 < puVar53);
            }
          }
          if (puVar40 < puVar37) {
            lVar42 = 0;
            do {
              *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
              lVar42 = lVar42 + 1;
            } while ((long)puVar37 - (long)puVar40 != lVar42);
          }
        }
        else {
          puVar53 = (ulong *)seqStore->lit;
          uVar44 = *(ulong *)((long)src + 8);
          *puVar53 = *src;
          puVar53[1] = uVar44;
          if (0x10 < uVar36) {
            pBVar28 = seqStore->lit;
            uVar44 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar28 + 0x18) = uVar44;
            if (0x20 < (long)uVar36) {
              lVar42 = 0;
              do {
                pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
                uVar20 = *(undefined8 *)(pBVar8 + 8);
                pBVar4 = pBVar28 + lVar42 + 0x20;
                *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar4 + 8) = uVar20;
                pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
                uVar20 = *(undefined8 *)(pBVar8 + 8);
                *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar4 + 0x18) = uVar20;
                lVar42 = lVar42 + 0x20;
              } while (pBVar4 + 0x20 < pBVar28 + uVar36);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        local_118 = (BYTE *)(sVar26 + 4);
        pBVar28 = (BYTE *)(sVar26 + 1);
        psVar17 = *ppsVar24;
        psVar17->litLength = (U16)uVar36;
        psVar17->offset = 1;
        goto joined_r0x006035c5;
      }
      if (uVar19 < uVar38) {
        puVar37 = (ulong *)(pBVar10 + uVar38);
        if (*puVar37 == uVar36) {
          puVar51 = puVar53 + 1;
          puVar41 = puVar37 + 1;
          puVar40 = puVar51;
          if (puVar51 < puVar1) {
            uVar44 = *puVar51 ^ *puVar41;
            uVar36 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
            if (*puVar41 == *puVar51) {
              puVar40 = puVar53 + 2;
              puVar41 = puVar37 + 2;
              do {
                if (puVar1 <= puVar40) goto LAB_0060345a;
                uVar36 = *puVar41;
                uVar44 = *puVar40;
                uVar49 = uVar44 ^ uVar36;
                uVar47 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51));
                puVar40 = puVar40 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar36 == uVar44);
            }
          }
          else {
LAB_0060345a:
            if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar40 < iEnd) {
              puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
            }
            pBVar28 = (BYTE *)((long)puVar40 - (long)puVar51);
          }
          local_118 = pBVar28 + 8;
          local_100 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar37);
          puVar37 = puVar53;
          if ((uVar19 < uVar38) && (src < puVar53)) {
            piVar27 = (int *)(pBVar25 + uVar38);
            do {
              puVar51 = (ulong *)((long)puVar53 + -1);
              puVar37 = puVar53;
              if ((*(BYTE *)puVar51 != (BYTE)*piVar27) ||
                 (local_118 = local_118 + 1, puVar37 = puVar51, piVar27 <= iStart)) break;
              piVar27 = (int *)((long)piVar27 + -1);
              puVar53 = puVar51;
            } while (src < puVar51);
          }
          goto LAB_00603908;
        }
LAB_006035f4:
        if (uVar19 < local_90) {
          piVar27 = (int *)(pBVar10 + local_90);
          if (*piVar27 != (int)*puVar53) {
LAB_00603648:
            puVar53 = (ulong *)((long)puVar53 + ((long)puVar53 - (long)src >> 8) + 1);
            goto LAB_00603c50;
          }
        }
        else {
          local_90 = pUVar16[uVar36 * -0x30e44323405a9d00 >> (0x40U - (char)uVar21 & 0x3f)];
          piVar27 = (int *)(pBVar12 + local_90);
          if ((local_90 <= uVar9) || (iVar50 = 10, *piVar27 != (int)*puVar53)) {
            iVar50 = 0;
          }
          if (iVar50 != 10) {
            if (iVar50 != 0) goto LAB_00603c50;
            goto LAB_00603648;
          }
          local_90 = local_90 + uVar45;
        }
        lVar42 = *(long *)((long)puVar53 + 1);
        uVar36 = (ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar30 & 0x3f);
        puVar37 = (ulong *)((long)puVar53 + 1);
        uVar38 = pUVar13[uVar36];
        pUVar13[uVar36] = UVar33;
        if (uVar19 < uVar38) {
          plVar6 = (long *)(pBVar10 + uVar38);
          if (*plVar6 == lVar42) {
            puVar51 = (ulong *)((long)puVar53 + 9);
            puVar41 = (ulong *)(plVar6 + 1);
            puVar40 = puVar51;
            if (puVar51 < puVar1) {
              uVar44 = *puVar51 ^ *puVar41;
              uVar36 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              local_118 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
              if (*puVar41 == *puVar51) {
                puVar40 = (ulong *)((long)puVar53 + 0x11);
                puVar41 = (ulong *)(plVar6 + 2);
                do {
                  if (puVar1 <= puVar40) goto LAB_00603cdb;
                  uVar36 = *puVar41;
                  uVar44 = *puVar40;
                  uVar49 = uVar44 ^ uVar36;
                  uVar47 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  local_118 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51))
                  ;
                  puVar40 = puVar40 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar36 == uVar44);
              }
            }
            else {
LAB_00603cdb:
              if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                puVar40 = (ulong *)((long)puVar40 + 4);
                puVar41 = (ulong *)((long)puVar41 + 4);
              }
              if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                puVar40 = (ulong *)((long)puVar40 + 2);
                puVar41 = (ulong *)((long)puVar41 + 2);
              }
              if (puVar40 < iEnd) {
                puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
              }
              local_118 = (BYTE *)((long)puVar40 - (long)puVar51);
            }
            local_118 = local_118 + 8;
            uVar34 = (int)puVar37 - (int)plVar6;
            iVar50 = 7;
            if (uVar19 < uVar38) {
              if (src < puVar37) {
                piVar29 = (int *)(pBVar25 + uVar38);
                do {
                  if ((BYTE)*puVar53 != (BYTE)*piVar29) goto LAB_00603d89;
                  local_118 = local_118 + 1;
                  puVar37 = puVar53;
                  iVar50 = 7;
                } while ((iStart < piVar29) &&
                        (piVar29 = (int *)((long)piVar29 + -1), bVar18 = src < puVar53,
                        puVar53 = (ulong *)((long)puVar53 + -1), bVar18));
              }
              else {
LAB_00603d91:
                iVar50 = 7;
              }
            }
          }
          else {
LAB_00603827:
            iVar50 = 0;
            uVar34 = (uint)local_100;
            puVar37 = puVar53;
          }
        }
        else {
          uVar38 = pUVar15[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar32 & 0x3f)];
          if ((uVar38 <= uVar9) || (*(long *)(pBVar12 + uVar38) != lVar42)) goto LAB_00603827;
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar53 + 9),(BYTE *)((long)(pBVar12 + uVar38) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          local_118 = (BYTE *)(sVar26 + 8);
          uVar34 = UVar33 - (uVar45 + uVar38);
          iVar50 = 7;
          if (uVar9 < uVar38) {
            if (puVar37 <= src) goto LAB_00603d91;
            piVar29 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
            do {
              if ((BYTE)*puVar53 != (BYTE)*piVar29) goto LAB_00603d89;
              local_118 = local_118 + 1;
              puVar37 = puVar53;
              iVar50 = 7;
            } while ((piVar39 < piVar29) &&
                    (piVar29 = (int *)((long)piVar29 + -1), bVar18 = src < puVar53,
                    puVar53 = (ulong *)((long)puVar53 + -1), bVar18));
          }
        }
        goto LAB_00603834;
      }
      uVar38 = pUVar15[uVar36 * -0x30e44323485a9b9d >> (bVar32 & 0x3f)];
      iVar50 = 0;
      if ((uVar9 < uVar38) && (*(ulong *)(pBVar12 + uVar38) == uVar36)) {
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar38) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        local_118 = (BYTE *)(sVar26 + 8);
        local_100 = (BYTE *)(ulong)(UVar52 - (uVar45 + uVar38));
        iVar22 = 7;
        iVar50 = 7;
        if ((uVar9 < uVar38) && (iVar50 = iVar22, src < puVar53)) {
          piVar27 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
          do {
            puVar37 = (ulong *)((long)puVar53 + -1);
            if ((*(BYTE *)puVar37 != (BYTE)*piVar27) ||
               (local_118 = local_118 + 1, puVar53 = puVar37, piVar27 <= piVar39)) break;
            piVar27 = (int *)((long)piVar27 + -1);
          } while (src < puVar37);
        }
      }
      puVar37 = puVar53;
      if (iVar50 == 7) goto LAB_00603908;
      if (iVar50 == 0) goto LAB_006035f4;
      goto LAB_00603c50;
    }
  }
  else if (puVar53 < puVar7) {
    bVar30 = 0x40 - (char)(ms->cParams).hashLog;
    bVar31 = 0x20 - (char)(ms->cParams).chainLog;
    bVar32 = 0x40 - (char)(pZVar11->cParams).hashLog;
    uVar21 = (pZVar11->cParams).chainLog;
    puVar1 = (ulong *)((long)iEnd + -7);
    puVar2 = (ulong *)((long)iEnd + -3);
    puVar3 = (ulong *)((long)iEnd + -1);
    puVar23 = iEnd + -4;
    ppsVar24 = &seqStore->sequences;
    pBVar25 = pBVar10 + -1;
    local_b8 = pBVar25;
LAB_00605c49:
    uVar36 = *puVar53;
    uVar44 = uVar36 * -0x30e44323485a9b9d >> (bVar30 & 0x3f);
    uVar34 = (int)*puVar53 * -0x61c8864f;
    uVar43 = uVar34 >> (bVar31 & 0x1f);
    UVar52 = (int)puVar53 - iVar48;
    uVar38 = pUVar13[uVar44];
    UVar33 = UVar52 + 1;
    uVar35 = UVar33 - local_134;
    piVar27 = (int *)(pBVar10 + uVar35);
    if (uVar35 < uVar19) {
      piVar27 = (int *)(pBVar12 + (uVar35 - uVar45));
    }
    uVar54 = pUVar14[uVar43];
    pUVar14[uVar43] = UVar52;
    pUVar13[uVar44] = UVar52;
    if ((uVar35 - uVar19 < 0xfffffffd) && (*piVar27 == *(int *)((long)puVar53 + 1))) {
      puVar37 = (ulong *)((long)puVar53 + 1);
      puVar51 = iEnd;
      if (uVar35 < uVar19) {
        puVar51 = mEnd;
      }
      sVar26 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar27 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar51,(BYTE *)iStart);
      uVar36 = (long)puVar37 - (long)src;
      if (puVar23 < puVar37) {
        puVar51 = (ulong *)seqStore->lit;
        puVar53 = puVar51;
        puVar40 = (ulong *)src;
        if (src <= puVar23) {
          puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
          uVar44 = *(ulong *)((long)src + 8);
          *puVar51 = *src;
          puVar51[1] = uVar44;
          puVar40 = puVar23;
          if (0x10 < (long)puVar23 - (long)src) {
            lVar42 = 0x10;
            do {
              uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
              puVar5 = (undefined8 *)((long)puVar51 + lVar42);
              *puVar5 = *(undefined8 *)((long)src + lVar42);
              puVar5[1] = uVar20;
              pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
              uVar20 = *(undefined8 *)(pBVar28 + 8);
              puVar5[2] = *(undefined8 *)pBVar28;
              puVar5[3] = uVar20;
              lVar42 = lVar42 + 0x20;
            } while (puVar5 + 4 < puVar53);
          }
        }
        if (puVar40 < puVar37) {
          lVar42 = 0;
          do {
            *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
            lVar42 = lVar42 + 1;
          } while ((long)puVar37 - (long)puVar40 != lVar42);
        }
      }
      else {
        puVar53 = (ulong *)seqStore->lit;
        uVar44 = *(ulong *)((long)src + 8);
        *puVar53 = *src;
        puVar53[1] = uVar44;
        if (0x10 < uVar36) {
          pBVar28 = seqStore->lit;
          uVar44 = *(ulong *)((long)src + 0x18);
          *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
          *(ulong *)(pBVar28 + 0x18) = uVar44;
          if (0x20 < (long)uVar36) {
            lVar42 = 0;
            do {
              pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
              uVar20 = *(undefined8 *)(pBVar8 + 8);
              pBVar4 = pBVar28 + lVar42 + 0x20;
              *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
              *(undefined8 *)(pBVar4 + 8) = uVar20;
              pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
              uVar20 = *(undefined8 *)(pBVar8 + 8);
              *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
              *(undefined8 *)(pBVar4 + 0x18) = uVar20;
              lVar42 = lVar42 + 0x20;
            } while (pBVar4 + 0x20 < pBVar28 + uVar36);
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar36;
      if (0xffff < uVar36) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      unaff_R15 = (BYTE *)(sVar26 + 4);
      pBVar28 = (BYTE *)(sVar26 + 1);
      psVar17 = *ppsVar24;
      psVar17->litLength = (U16)uVar36;
      psVar17->offset = 1;
      goto joined_r0x006060fa;
    }
    if (uVar19 < uVar38) {
      puVar37 = (ulong *)(pBVar10 + uVar38);
      if (*puVar37 == *puVar53) {
        puVar51 = puVar53 + 1;
        puVar41 = puVar37 + 1;
        puVar40 = puVar51;
        if (puVar51 < puVar1) {
          uVar44 = *puVar51 ^ *puVar41;
          uVar36 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
          if (*puVar41 == *puVar51) {
            puVar40 = puVar53 + 2;
            puVar41 = puVar37 + 2;
            do {
              if (puVar1 <= puVar40) goto LAB_00605f9a;
              uVar36 = *puVar41;
              uVar44 = *puVar40;
              uVar49 = uVar44 ^ uVar36;
              uVar47 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51));
              puVar40 = puVar40 + 1;
              puVar41 = puVar41 + 1;
            } while (uVar36 == uVar44);
          }
        }
        else {
LAB_00605f9a:
          if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
            puVar40 = (ulong *)((long)puVar40 + 4);
            puVar41 = (ulong *)((long)puVar41 + 4);
          }
          if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
            puVar40 = (ulong *)((long)puVar40 + 2);
            puVar41 = (ulong *)((long)puVar41 + 2);
          }
          if (puVar40 < iEnd) {
            puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
          }
          pBVar28 = (BYTE *)((long)puVar40 - (long)puVar51);
        }
        unaff_R15 = pBVar28 + 8;
        local_b8 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar37);
        puVar37 = puVar53;
        if ((uVar38 <= uVar19) || (puVar53 <= src)) goto LAB_0060661d;
        piVar27 = (int *)(pBVar25 + uVar38);
        puVar37 = (ulong *)((long)puVar53 + -1);
        do {
          if ((BYTE)*puVar37 != (BYTE)*piVar27) goto LAB_0060660d;
          unaff_R15 = unaff_R15 + 1;
          puVar53 = (ulong *)((long)puVar37 + -1);
        } while ((iStart < piVar27) &&
                (piVar27 = (int *)((long)piVar27 + -1), bVar18 = src < puVar37, puVar37 = puVar53,
                bVar18));
        goto LAB_00606042;
      }
LAB_00606132:
      if (uVar19 < uVar54) {
        piVar27 = (int *)(pBVar10 + uVar54);
        if (*piVar27 != (int)*puVar53) {
LAB_0060618d:
          puVar53 = (ulong *)((long)puVar53 + ((long)puVar53 - (long)src >> 8) + 1);
          goto LAB_00606949;
        }
      }
      else {
        uVar54 = pUVar16[uVar34 >> (0x20U - (char)uVar21 & 0x1f)];
        piVar27 = (int *)(pBVar12 + uVar54);
        if ((uVar54 <= uVar9) || (iVar50 = 10, *piVar27 != (int)*puVar53)) {
          iVar50 = 0;
        }
        if (iVar50 != 10) {
          if (iVar50 != 0) goto LAB_00606949;
          goto LAB_0060618d;
        }
        uVar54 = uVar54 + uVar45;
      }
      lVar42 = *(long *)((long)puVar53 + 1);
      uVar36 = (ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar30 & 0x3f);
      puVar37 = (ulong *)((long)puVar53 + 1);
      uVar38 = pUVar13[uVar36];
      pUVar13[uVar36] = UVar33;
      if (uVar19 < uVar38) {
        plVar6 = (long *)(pBVar10 + uVar38);
        iVar50 = 0;
        if (*plVar6 == lVar42) {
          puVar51 = (ulong *)((long)puVar53 + 9);
          puVar41 = (ulong *)(plVar6 + 1);
          puVar40 = puVar51;
          if (puVar51 < puVar1) {
            uVar44 = *puVar51 ^ *puVar41;
            uVar36 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
            if (*puVar41 == *puVar51) {
              puVar40 = (ulong *)((long)puVar53 + 0x11);
              puVar41 = (ulong *)(plVar6 + 2);
              do {
                if (puVar1 <= puVar40) goto LAB_006064c1;
                uVar36 = *puVar41;
                uVar44 = *puVar40;
                uVar49 = uVar44 ^ uVar36;
                uVar47 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar51));
                puVar40 = puVar40 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar36 == uVar44);
            }
          }
          else {
LAB_006064c1:
            if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
              puVar40 = (ulong *)((long)puVar40 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar40 < iEnd) {
              puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40));
            }
            pBVar28 = (BYTE *)((long)puVar40 - (long)puVar51);
          }
          unaff_R15 = pBVar28 + 8;
          local_b8 = (BYTE *)(ulong)(uint)((int)puVar37 - (int)plVar6);
          iVar50 = 7;
          iVar22 = 7;
          if ((uVar19 < uVar38) && (iVar50 = iVar22, src < puVar37)) {
            piVar29 = (int *)(pBVar25 + uVar38);
            while ((BYTE)*puVar53 == (BYTE)*piVar29) {
              unaff_R15 = unaff_R15 + 1;
              puVar37 = puVar53;
              if ((piVar29 <= iStart) ||
                 (piVar29 = (int *)((long)piVar29 + -1), bVar18 = puVar53 <= src,
                 puVar53 = (ulong *)((long)puVar53 + -1), bVar18)) goto LAB_00606370;
            }
            puVar37 = (ulong *)((long)puVar53 + 1);
          }
        }
        else {
          local_b8 = (BYTE *)((ulong)local_b8 & 0xffffffff);
          puVar37 = puVar53;
        }
      }
      else {
        uVar38 = pUVar15[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar32 & 0x3f)];
        if ((uVar9 < uVar38) && (*(long *)(pBVar12 + uVar38) == lVar42)) {
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar53 + 9),(BYTE *)((long)(pBVar12 + uVar38) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          unaff_R15 = (BYTE *)(sVar26 + 8);
          local_b8 = (BYTE *)(ulong)(UVar33 - (uVar45 + uVar38));
          iVar22 = 7;
          iVar50 = 7;
          if ((uVar9 < uVar38) && (iVar50 = iVar22, src < puVar37)) {
            piVar29 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
            while ((BYTE)*puVar53 == (BYTE)*piVar29) {
              unaff_R15 = unaff_R15 + 1;
              puVar37 = puVar53;
              if ((piVar29 <= piVar39) ||
                 (piVar29 = (int *)((long)piVar29 + -1), bVar18 = puVar53 <= src,
                 puVar53 = (ulong *)((long)puVar53 + -1), bVar18)) goto LAB_00606370;
            }
            puVar37 = (ulong *)((long)puVar53 + 1);
          }
        }
        else {
          local_b8 = (BYTE *)((ulong)local_b8 & 0xffffffff);
          puVar37 = puVar53;
          iVar50 = 0;
        }
      }
LAB_00606370:
      if (iVar50 == 7) goto LAB_0060661d;
      puVar53 = puVar37;
      if (iVar50 != 0) goto LAB_00606949;
      puVar53 = (ulong *)((long)puVar37 + 4);
      puVar51 = (ulong *)(piVar27 + 1);
      if (uVar54 < uVar19) {
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)puVar53,(BYTE *)puVar51,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart
                           );
        unaff_R15 = (BYTE *)(sVar26 + 4);
        local_b8 = (BYTE *)(ulong)(UVar52 - uVar54);
        if ((piVar39 < piVar27) && (src < puVar37)) {
          puVar37 = (ulong *)((long)puVar37 + -1);
          do {
            piVar27 = (int *)((long)piVar27 + -1);
            if ((BYTE)*puVar37 != *(BYTE *)piVar27) goto LAB_0060660d;
            unaff_R15 = unaff_R15 + 1;
            puVar53 = (ulong *)((long)puVar37 + -1);
          } while ((piVar39 < piVar27) && (bVar18 = src < puVar37, puVar37 = puVar53, bVar18));
LAB_00606042:
          puVar37 = (ulong *)((long)puVar53 + 1);
        }
      }
      else {
        puVar40 = puVar53;
        if (puVar53 < puVar1) {
          uVar44 = *puVar53 ^ *puVar51;
          uVar36 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
          if (*puVar51 == *puVar53) {
            puVar40 = (ulong *)((long)puVar37 + 0xc);
            puVar51 = (ulong *)(piVar27 + 3);
            do {
              if (puVar1 <= puVar40) goto LAB_00606570;
              uVar36 = *puVar51;
              uVar44 = *puVar40;
              uVar49 = uVar44 ^ uVar36;
              uVar47 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar53));
              puVar40 = puVar40 + 1;
              puVar51 = puVar51 + 1;
            } while (uVar36 == uVar44);
          }
        }
        else {
LAB_00606570:
          if ((puVar40 < puVar2) && ((int)*puVar51 == (int)*puVar40)) {
            puVar40 = (ulong *)((long)puVar40 + 4);
            puVar51 = (ulong *)((long)puVar51 + 4);
          }
          if ((puVar40 < puVar3) && ((short)*puVar51 == (short)*puVar40)) {
            puVar40 = (ulong *)((long)puVar40 + 2);
            puVar51 = (ulong *)((long)puVar51 + 2);
          }
          if (puVar40 < iEnd) {
            puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar40));
          }
          pBVar28 = (BYTE *)((long)puVar40 - (long)puVar53);
        }
        unaff_R15 = pBVar28 + 4;
        local_b8 = (BYTE *)(ulong)(uint)((int)puVar37 - (int)piVar27);
        if ((iStart < piVar27) && (src < puVar37)) {
          puVar37 = (ulong *)((long)puVar37 + -1);
          do {
            piVar27 = (int *)((long)piVar27 + -1);
            if ((BYTE)*puVar37 != *(BYTE *)piVar27) goto LAB_0060660d;
            unaff_R15 = unaff_R15 + 1;
            puVar53 = (ulong *)((long)puVar37 + -1);
          } while ((iStart < piVar27) && (bVar18 = src < puVar37, puVar37 = puVar53, bVar18));
          goto LAB_00606042;
        }
      }
      goto LAB_0060661d;
    }
    uVar38 = pUVar15[uVar36 * -0x30e44323485a9b9d >> (bVar32 & 0x3f)];
    iVar50 = 0;
    if ((uVar9 < uVar38) && (*(ulong *)(pBVar12 + uVar38) == *puVar53)) {
      sVar26 = ZSTD_count_2segments
                         ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar38) + 8),(BYTE *)iEnd,
                          (BYTE *)mEnd,(BYTE *)iStart);
      unaff_R15 = (BYTE *)(sVar26 + 8);
      local_b8 = (BYTE *)(ulong)(UVar52 - (uVar45 + uVar38));
      iVar22 = 7;
      iVar50 = 7;
      if ((uVar9 < uVar38) && (iVar50 = iVar22, src < puVar53)) {
        piVar27 = (int *)(pBVar12 + ((ulong)uVar38 - 1));
        do {
          puVar37 = (ulong *)((long)puVar53 + -1);
          if ((*(BYTE *)puVar37 != (BYTE)*piVar27) ||
             (unaff_R15 = unaff_R15 + 1, puVar53 = puVar37, piVar27 <= piVar39)) break;
          piVar27 = (int *)((long)piVar27 + -1);
        } while (src < puVar37);
      }
    }
    puVar37 = puVar53;
    if (iVar50 == 7) goto LAB_0060661d;
    if (iVar50 == 0) goto LAB_00606132;
    goto LAB_00606949;
  }
LAB_006069a0:
  *rep = local_134;
  rep[1] = local_138;
  return (long)iEnd - (long)src;
LAB_00605a79:
  puVar37 = (ulong *)((long)puVar53 + 1);
  iVar50 = 7;
LAB_00605524:
  if (iVar50 == 7) {
    local_100 = (BYTE *)(ulong)uVar34;
  }
  else {
    if (iVar50 != 0) {
      local_100 = (BYTE *)(ulong)uVar34;
      puVar53 = puVar37;
      goto LAB_00605940;
    }
    puVar53 = (ulong *)((long)puVar37 + 4);
    puVar51 = (ulong *)(piVar27 + 1);
    if (local_90 < uVar19) {
      sVar26 = ZSTD_count_2segments
                         ((BYTE *)puVar53,(BYTE *)puVar51,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      local_118 = (BYTE *)(sVar26 + 4);
      local_100 = (BYTE *)(ulong)(UVar52 - local_90);
      if ((piVar39 < piVar27) && (src < puVar37)) {
        while( true ) {
          puVar53 = (ulong *)((long)puVar37 + -1);
          piVar27 = (int *)((long)piVar27 + -1);
          if (*(BYTE *)puVar53 != *(BYTE *)piVar27) break;
          local_118 = local_118 + 1;
          puVar37 = puVar53;
          if ((piVar27 <= piVar39) || (puVar53 <= src)) break;
        }
      }
    }
    else {
      puVar40 = puVar53;
      if (puVar53 < puVar1) {
        uVar44 = *puVar53 ^ *puVar51;
        uVar36 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
        if (*puVar51 == *puVar53) {
          puVar40 = (ulong *)((long)puVar37 + 0xc);
          puVar51 = (ulong *)(piVar27 + 3);
          do {
            if (puVar1 <= puVar40) goto LAB_00605a8c;
            uVar36 = *puVar51;
            uVar44 = *puVar40;
            uVar49 = uVar44 ^ uVar36;
            uVar47 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
              }
            }
            pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar53));
            puVar40 = puVar40 + 1;
            puVar51 = puVar51 + 1;
          } while (uVar36 == uVar44);
        }
      }
      else {
LAB_00605a8c:
        if ((puVar40 < puVar2) && ((int)*puVar51 == (int)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 4);
          puVar51 = (ulong *)((long)puVar51 + 4);
        }
        if ((puVar40 < puVar3) && ((short)*puVar51 == (short)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 2);
          puVar51 = (ulong *)((long)puVar51 + 2);
        }
        if (puVar40 < iEnd) {
          puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar40));
        }
        pBVar28 = (BYTE *)((long)puVar40 - (long)puVar53);
      }
      local_118 = pBVar28 + 4;
      local_100 = (BYTE *)(ulong)(uint)((int)puVar37 - (int)piVar27);
      if ((iStart < piVar27) && (src < puVar37)) {
        while( true ) {
          piVar27 = (int *)((long)piVar27 + -1);
          puVar53 = (ulong *)((long)puVar37 + -1);
          if (*(BYTE *)puVar53 != *(BYTE *)piVar27) break;
          local_118 = local_118 + 1;
          puVar37 = puVar53;
          if ((piVar27 <= iStart) || (puVar53 <= src)) break;
        }
      }
    }
  }
LAB_006055f8:
  uVar36 = (long)puVar37 - (long)src;
  if (puVar23 < puVar37) {
    puVar51 = (ulong *)seqStore->lit;
    puVar53 = puVar51;
    puVar40 = (ulong *)src;
    if (src <= puVar23) {
      puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
      uVar44 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar44;
      puVar40 = puVar23;
      if (0x10 < (long)puVar23 - (long)src) {
        lVar42 = 0x10;
        do {
          uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
          puVar5 = (undefined8 *)((long)puVar51 + lVar42);
          *puVar5 = *(undefined8 *)((long)src + lVar42);
          puVar5[1] = uVar20;
          pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
          uVar20 = *(undefined8 *)(pBVar28 + 8);
          puVar5[2] = *(undefined8 *)pBVar28;
          puVar5[3] = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (puVar5 + 4 < puVar53);
      }
    }
    if (puVar40 < puVar37) {
      lVar42 = 0;
      do {
        *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
        lVar42 = lVar42 + 1;
      } while ((long)puVar37 - (long)puVar40 != lVar42);
    }
  }
  else {
    puVar53 = (ulong *)seqStore->lit;
    uVar44 = *(ulong *)((long)src + 8);
    *puVar53 = *src;
    puVar53[1] = uVar44;
    if (0x10 < uVar36) {
      pBVar28 = seqStore->lit;
      uVar44 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar28 + 0x18) = uVar44;
      if (0x20 < (long)uVar36) {
        lVar42 = 0;
        do {
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          pBVar4 = pBVar28 + lVar42 + 0x20;
          *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 8) = uVar20;
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 0x18) = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (pBVar4 + 0x20 < pBVar28 + uVar36);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar28 = local_118 + -3;
  psVar17 = *ppsVar24;
  psVar17->litLength = (U16)uVar36;
  psVar17->offset = (U32)local_100 + 3;
  local_138 = local_134;
  local_134 = (U32)local_100;
joined_r0x006052b5:
  if ((BYTE *)0xffff < pBVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar17->matchLength = (U16)pBVar28;
  *ppsVar24 = psVar17 + 1;
  src = (void *)((long)puVar37 + (long)local_118);
  puVar53 = (ulong *)src;
  if (src <= puVar7) {
    uVar38 = UVar52 + 2;
    lVar42 = *(long *)(pBVar10 + uVar38);
    pUVar13[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] = uVar38;
    pUVar13[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] =
         ((int)src + -2) - iVar48;
    pUVar14[(ulong)(lVar42 * -0x30e4432345000000) >> (bVar31 & 0x3f)] = uVar38;
    pUVar14[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar31 & 0x3f)] =
         ((int)src + -1) - iVar48;
    do {
      puVar53 = (ulong *)src;
      if (puVar7 < src) break;
      UVar33 = (int)src - iVar48;
      uVar38 = UVar33 - local_138;
      pBVar28 = pBVar10;
      if (uVar38 < uVar19) {
        pBVar28 = pBVar12 + -uVar46;
      }
      if ((uVar38 - uVar19 < 0xfffffffd) && (*(int *)(pBVar28 + uVar38) == (int)*src)) {
        puVar53 = iEnd;
        if (uVar38 < uVar19) {
          puVar53 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar28 + uVar38) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar53,(BYTE *)iStart);
        if (src <= puVar23) {
          puVar53 = (ulong *)seqStore->lit;
          uVar36 = *(ulong *)((long)src + 8);
          *puVar53 = *src;
          puVar53[1] = uVar36;
        }
        psVar17 = seqStore->sequences;
        psVar17->litLength = 0;
        psVar17->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar17->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = psVar17 + 1;
        uVar36 = *src;
        pUVar14[uVar36 * -0x30e4432345000000 >> (bVar31 & 0x3f)] = UVar33;
        pUVar13[uVar36 * -0x30e44323485a9b9d >> (bVar30 & 0x3f)] = UVar33;
        src = (void *)((long)src + sVar26 + 4);
        bVar18 = true;
        UVar33 = local_134;
        local_134 = local_138;
      }
      else {
        bVar18 = false;
        UVar33 = local_138;
      }
      local_138 = UVar33;
      puVar53 = (ulong *)src;
    } while (bVar18);
  }
LAB_00605940:
  if (puVar7 <= puVar53) goto LAB_006069a0;
  goto LAB_00604dee;
LAB_00604bf8:
  puVar37 = (ulong *)((long)puVar53 + 1);
  iVar50 = 7;
LAB_006046a4:
  if (iVar50 != 7) {
    puVar53 = puVar37;
    if (iVar50 != 0) goto LAB_00604ab7;
    puVar53 = (ulong *)((long)puVar37 + 4);
    puVar51 = (ulong *)(piVar27 + 1);
    if (local_90 < uVar19) {
      sVar26 = ZSTD_count_2segments
                         ((BYTE *)puVar53,(BYTE *)puVar51,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      local_120 = (BYTE *)(sVar26 + 4);
      local_100 = (BYTE *)(ulong)(UVar52 - local_90);
      if (piVar39 < piVar27) {
        while (src < puVar37) {
          piVar27 = (int *)((long)piVar27 + -1);
          puVar53 = (ulong *)((long)puVar37 + -1);
          if ((*(BYTE *)puVar53 != *(BYTE *)piVar27) ||
             (local_120 = local_120 + 1, puVar37 = puVar53, piVar27 <= piVar39)) break;
        }
      }
    }
    else {
      puVar40 = puVar53;
      if (puVar53 < puVar1) {
        uVar44 = *puVar53 ^ *puVar51;
        uVar36 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
        if (*puVar51 == *puVar53) {
          puVar40 = (ulong *)((long)puVar37 + 0xc);
          puVar51 = (ulong *)(piVar27 + 3);
          do {
            if (puVar1 <= puVar40) goto LAB_00604c03;
            uVar36 = *puVar51;
            uVar44 = *puVar40;
            uVar49 = uVar44 ^ uVar36;
            uVar47 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
              }
            }
            pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar53));
            puVar40 = puVar40 + 1;
            puVar51 = puVar51 + 1;
          } while (uVar36 == uVar44);
        }
      }
      else {
LAB_00604c03:
        if ((puVar40 < puVar2) && ((int)*puVar51 == (int)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 4);
          puVar51 = (ulong *)((long)puVar51 + 4);
        }
        if ((puVar40 < puVar3) && ((short)*puVar51 == (short)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 2);
          puVar51 = (ulong *)((long)puVar51 + 2);
        }
        if (puVar40 < iEnd) {
          puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar40));
        }
        pBVar28 = (BYTE *)((long)puVar40 - (long)puVar53);
      }
      local_120 = pBVar28 + 4;
      local_100 = (BYTE *)(ulong)(uint)((int)puVar37 - (int)piVar27);
      if ((iStart < piVar27) && (src < puVar37)) {
        while( true ) {
          piVar27 = (int *)((long)piVar27 + -1);
          puVar53 = (ulong *)((long)puVar37 + -1);
          if (*(BYTE *)puVar53 != *(BYTE *)piVar27) break;
          local_120 = local_120 + 1;
          puVar37 = puVar53;
          if ((piVar27 <= iStart) || (puVar53 <= src)) break;
        }
      }
    }
  }
LAB_0060477a:
  uVar36 = (long)puVar37 - (long)src;
  if (puVar23 < puVar37) {
    puVar51 = (ulong *)seqStore->lit;
    puVar53 = puVar51;
    puVar40 = (ulong *)src;
    if (src <= puVar23) {
      puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
      uVar44 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar44;
      puVar40 = puVar23;
      if (0x10 < (long)puVar23 - (long)src) {
        lVar42 = 0x10;
        do {
          uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
          puVar5 = (undefined8 *)((long)puVar51 + lVar42);
          *puVar5 = *(undefined8 *)((long)src + lVar42);
          puVar5[1] = uVar20;
          pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
          uVar20 = *(undefined8 *)(pBVar28 + 8);
          puVar5[2] = *(undefined8 *)pBVar28;
          puVar5[3] = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (puVar5 + 4 < puVar53);
      }
    }
    if (puVar40 < puVar37) {
      lVar42 = 0;
      do {
        *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
        lVar42 = lVar42 + 1;
      } while ((long)puVar37 - (long)puVar40 != lVar42);
    }
  }
  else {
    puVar53 = (ulong *)seqStore->lit;
    uVar44 = *(ulong *)((long)src + 8);
    *puVar53 = *src;
    puVar53[1] = uVar44;
    if (0x10 < uVar36) {
      pBVar28 = seqStore->lit;
      uVar44 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar28 + 0x18) = uVar44;
      if (0x20 < (long)uVar36) {
        lVar42 = 0;
        do {
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          pBVar4 = pBVar28 + lVar42 + 0x20;
          *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 8) = uVar20;
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 0x18) = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (pBVar4 + 0x20 < pBVar28 + uVar36);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar28 = local_120 + -3;
  psVar17 = *ppsVar24;
  psVar17->litLength = (U16)uVar36;
  psVar17->offset = (U32)local_100 + 3;
  local_138 = local_134;
  local_134 = (U32)local_100;
joined_r0x00604434:
  if ((BYTE *)0xffff < pBVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar17->matchLength = (U16)pBVar28;
  *ppsVar24 = psVar17 + 1;
  src = (void *)((long)puVar37 + (long)local_120);
  puVar53 = (ulong *)src;
  if (src <= puVar7) {
    uVar38 = UVar52 + 2;
    lVar42 = *(long *)(pBVar10 + uVar38);
    pUVar13[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] = uVar38;
    pUVar13[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] =
         ((int)src + -2) - iVar48;
    pUVar14[(ulong)(lVar42 * -0x30e4432340650000) >> (bVar31 & 0x3f)] = uVar38;
    pUVar14[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar31 & 0x3f)] =
         ((int)src + -1) - iVar48;
    do {
      puVar53 = (ulong *)src;
      if (puVar7 < src) break;
      UVar33 = (int)src - iVar48;
      uVar38 = UVar33 - local_138;
      pBVar28 = pBVar10;
      if (uVar38 < uVar19) {
        pBVar28 = pBVar12 + -uVar46;
      }
      if ((uVar38 - uVar19 < 0xfffffffd) && (*(int *)(pBVar28 + uVar38) == (int)*src)) {
        puVar53 = iEnd;
        if (uVar38 < uVar19) {
          puVar53 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar28 + uVar38) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar53,(BYTE *)iStart);
        if (src <= puVar23) {
          puVar53 = (ulong *)seqStore->lit;
          uVar36 = *(ulong *)((long)src + 8);
          *puVar53 = *src;
          puVar53[1] = uVar36;
        }
        psVar17 = seqStore->sequences;
        psVar17->litLength = 0;
        psVar17->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar17->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = psVar17 + 1;
        uVar36 = *src;
        pUVar14[uVar36 * -0x30e4432340650000 >> (bVar31 & 0x3f)] = UVar33;
        pUVar13[uVar36 * -0x30e44323485a9b9d >> (bVar30 & 0x3f)] = UVar33;
        src = (void *)((long)src + sVar26 + 4);
        bVar18 = true;
        UVar33 = local_134;
        local_134 = local_138;
      }
      else {
        bVar18 = false;
        UVar33 = local_138;
      }
      local_138 = UVar33;
      puVar53 = (ulong *)src;
    } while (bVar18);
  }
LAB_00604ab7:
  if (puVar7 <= puVar53) goto LAB_006069a0;
  goto LAB_00603f5b;
LAB_0060660d:
  puVar37 = (ulong *)((long)puVar37 + 1);
LAB_0060661d:
  uVar36 = (long)puVar37 - (long)src;
  if (puVar23 < puVar37) {
    puVar51 = (ulong *)seqStore->lit;
    puVar53 = puVar51;
    puVar40 = (ulong *)src;
    if (src <= puVar23) {
      puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
      uVar44 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar44;
      puVar40 = puVar23;
      if (0x10 < (long)puVar23 - (long)src) {
        lVar42 = 0x10;
        do {
          uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
          puVar5 = (undefined8 *)((long)puVar51 + lVar42);
          *puVar5 = *(undefined8 *)((long)src + lVar42);
          puVar5[1] = uVar20;
          pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
          uVar20 = *(undefined8 *)(pBVar28 + 8);
          puVar5[2] = *(undefined8 *)pBVar28;
          puVar5[3] = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (puVar5 + 4 < puVar53);
      }
    }
    if (puVar40 < puVar37) {
      lVar42 = 0;
      do {
        *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
        lVar42 = lVar42 + 1;
      } while ((long)puVar37 - (long)puVar40 != lVar42);
    }
  }
  else {
    puVar53 = (ulong *)seqStore->lit;
    uVar44 = *(ulong *)((long)src + 8);
    *puVar53 = *src;
    puVar53[1] = uVar44;
    if (0x10 < uVar36) {
      pBVar28 = seqStore->lit;
      uVar44 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar28 + 0x18) = uVar44;
      if (0x20 < (long)uVar36) {
        lVar42 = 0;
        do {
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          pBVar4 = pBVar28 + lVar42 + 0x20;
          *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 8) = uVar20;
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 0x18) = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (pBVar4 + 0x20 < pBVar28 + uVar36);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar28 = unaff_R15 + -3;
  psVar17 = *ppsVar24;
  psVar17->litLength = (U16)uVar36;
  psVar17->offset = (U32)local_b8 + 3;
  local_138 = local_134;
  local_134 = (U32)local_b8;
joined_r0x006060fa:
  if ((BYTE *)0xffff < pBVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar17->matchLength = (U16)pBVar28;
  *ppsVar24 = psVar17 + 1;
  src = (void *)((long)puVar37 + (long)unaff_R15);
  puVar53 = (ulong *)src;
  if (src <= puVar7) {
    uVar38 = UVar52 + 2;
    pUVar13[(ulong)(*(long *)(pBVar10 + uVar38) * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] = uVar38;
    pUVar13[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] =
         ((int)src + -2) - iVar48;
    pUVar14[(uint)(*(int *)(pBVar10 + uVar38) * -0x61c8864f) >> (bVar31 & 0x1f)] = uVar38;
    pUVar14[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar31 & 0x1f)] =
         ((int)src + -1) - iVar48;
    do {
      puVar53 = (ulong *)src;
      if (puVar7 < src) break;
      UVar33 = (int)src - iVar48;
      uVar38 = UVar33 - local_138;
      pBVar28 = pBVar10;
      if (uVar38 < uVar19) {
        pBVar28 = pBVar12 + -uVar46;
      }
      if ((uVar38 - uVar19 < 0xfffffffd) && (*(int *)(pBVar28 + uVar38) == (int)*src)) {
        puVar53 = iEnd;
        if (uVar38 < uVar19) {
          puVar53 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar28 + uVar38) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar53,(BYTE *)iStart);
        if (src <= puVar23) {
          puVar53 = (ulong *)seqStore->lit;
          uVar36 = *(ulong *)((long)src + 8);
          *puVar53 = *src;
          puVar53[1] = uVar36;
        }
        psVar17 = seqStore->sequences;
        psVar17->litLength = 0;
        psVar17->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar17->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = psVar17 + 1;
        pUVar14[(uint)((int)*src * -0x61c8864f) >> (bVar31 & 0x1f)] = UVar33;
        pUVar13[*src * -0x30e44323485a9b9d >> (bVar30 & 0x3f)] = UVar33;
        src = (void *)((long)src + sVar26 + 4);
        bVar18 = true;
        UVar33 = local_134;
        local_134 = local_138;
      }
      else {
        bVar18 = false;
        UVar33 = local_138;
      }
      local_138 = UVar33;
      puVar53 = (ulong *)src;
    } while (bVar18);
  }
LAB_00606949:
  if (puVar7 <= puVar53) goto LAB_006069a0;
  goto LAB_00605c49;
LAB_00603d89:
  puVar37 = (ulong *)((long)puVar53 + 1);
  iVar50 = 7;
LAB_00603834:
  if (iVar50 == 7) {
    local_100 = (BYTE *)(ulong)uVar34;
  }
  else {
    if (iVar50 != 0) {
      local_100 = (BYTE *)(ulong)uVar34;
      puVar53 = puVar37;
      goto LAB_00603c50;
    }
    puVar53 = (ulong *)((long)puVar37 + 4);
    puVar51 = (ulong *)(piVar27 + 1);
    if (local_90 < uVar19) {
      sVar26 = ZSTD_count_2segments
                         ((BYTE *)puVar53,(BYTE *)puVar51,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      local_118 = (BYTE *)(sVar26 + 4);
      local_100 = (BYTE *)(ulong)(UVar52 - local_90);
      if ((piVar39 < piVar27) && (src < puVar37)) {
        while( true ) {
          puVar53 = (ulong *)((long)puVar37 + -1);
          piVar27 = (int *)((long)piVar27 + -1);
          if (*(BYTE *)puVar53 != *(BYTE *)piVar27) break;
          local_118 = local_118 + 1;
          puVar37 = puVar53;
          if ((piVar27 <= piVar39) || (puVar53 <= src)) break;
        }
      }
    }
    else {
      puVar40 = puVar53;
      if (puVar53 < puVar1) {
        uVar44 = *puVar53 ^ *puVar51;
        uVar36 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        pBVar28 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
        if (*puVar51 == *puVar53) {
          puVar40 = (ulong *)((long)puVar37 + 0xc);
          puVar51 = (ulong *)(piVar27 + 3);
          do {
            if (puVar1 <= puVar40) goto LAB_00603d9c;
            uVar36 = *puVar51;
            uVar44 = *puVar40;
            uVar49 = uVar44 ^ uVar36;
            uVar47 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
              }
            }
            pBVar28 = (BYTE *)((long)puVar40 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar53));
            puVar40 = puVar40 + 1;
            puVar51 = puVar51 + 1;
          } while (uVar36 == uVar44);
        }
      }
      else {
LAB_00603d9c:
        if ((puVar40 < puVar2) && ((int)*puVar51 == (int)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 4);
          puVar51 = (ulong *)((long)puVar51 + 4);
        }
        if ((puVar40 < puVar3) && ((short)*puVar51 == (short)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 2);
          puVar51 = (ulong *)((long)puVar51 + 2);
        }
        if (puVar40 < iEnd) {
          puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar40));
        }
        pBVar28 = (BYTE *)((long)puVar40 - (long)puVar53);
      }
      local_118 = pBVar28 + 4;
      local_100 = (BYTE *)(ulong)(uint)((int)puVar37 - (int)piVar27);
      if ((iStart < piVar27) && (src < puVar37)) {
        while( true ) {
          piVar27 = (int *)((long)piVar27 + -1);
          puVar53 = (ulong *)((long)puVar37 + -1);
          if (*(BYTE *)puVar53 != *(BYTE *)piVar27) break;
          local_118 = local_118 + 1;
          puVar37 = puVar53;
          if ((piVar27 <= iStart) || (puVar53 <= src)) break;
        }
      }
    }
  }
LAB_00603908:
  uVar36 = (long)puVar37 - (long)src;
  if (puVar23 < puVar37) {
    puVar51 = (ulong *)seqStore->lit;
    puVar53 = puVar51;
    puVar40 = (ulong *)src;
    if (src <= puVar23) {
      puVar53 = (ulong *)((long)puVar51 + ((long)puVar23 - (long)src));
      uVar44 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar44;
      puVar40 = puVar23;
      if (0x10 < (long)puVar23 - (long)src) {
        lVar42 = 0x10;
        do {
          uVar20 = *(undefined8 *)((BYTE *)((long)src + lVar42) + 8);
          puVar5 = (undefined8 *)((long)puVar51 + lVar42);
          *puVar5 = *(undefined8 *)((long)src + lVar42);
          puVar5[1] = uVar20;
          pBVar28 = (BYTE *)((long)src + lVar42 + 0x10);
          uVar20 = *(undefined8 *)(pBVar28 + 8);
          puVar5[2] = *(undefined8 *)pBVar28;
          puVar5[3] = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (puVar5 + 4 < puVar53);
      }
    }
    if (puVar40 < puVar37) {
      lVar42 = 0;
      do {
        *(BYTE *)((long)puVar53 + lVar42) = *(BYTE *)((long)puVar40 + lVar42);
        lVar42 = lVar42 + 1;
      } while ((long)puVar37 - (long)puVar40 != lVar42);
    }
  }
  else {
    puVar53 = (ulong *)seqStore->lit;
    uVar44 = *(ulong *)((long)src + 8);
    *puVar53 = *src;
    puVar53[1] = uVar44;
    if (0x10 < uVar36) {
      pBVar28 = seqStore->lit;
      uVar44 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar28 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar28 + 0x18) = uVar44;
      if (0x20 < (long)uVar36) {
        lVar42 = 0;
        do {
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x20);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          pBVar4 = pBVar28 + lVar42 + 0x20;
          *(undefined8 *)pBVar4 = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 8) = uVar20;
          pBVar8 = (BYTE *)((long)src + lVar42 + 0x30);
          uVar20 = *(undefined8 *)(pBVar8 + 8);
          *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar4 + 0x18) = uVar20;
          lVar42 = lVar42 + 0x20;
        } while (pBVar4 + 0x20 < pBVar28 + uVar36);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar36;
  if (0xffff < uVar36) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar28 = local_118 + -3;
  psVar17 = *ppsVar24;
  psVar17->litLength = (U16)uVar36;
  psVar17->offset = (U32)local_100 + 3;
  local_138 = local_134;
  local_134 = (U32)local_100;
joined_r0x006035c5:
  if ((BYTE *)0xffff < pBVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar17->matchLength = (U16)pBVar28;
  *ppsVar24 = psVar17 + 1;
  src = (void *)((long)puVar37 + (long)local_118);
  puVar53 = (ulong *)src;
  if (src <= puVar7) {
    uVar38 = UVar52 + 2;
    lVar42 = *(long *)(pBVar10 + uVar38);
    pUVar13[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] = uVar38;
    pUVar13[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar30 & 0x3f)] =
         ((int)src + -2) - iVar48;
    pUVar14[(ulong)(lVar42 * -0x30e44323405a9d00) >> (bVar31 & 0x3f)] = uVar38;
    pUVar14[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar31 & 0x3f)] =
         ((int)src + -1) - iVar48;
    do {
      puVar53 = (ulong *)src;
      if (puVar7 < src) break;
      UVar33 = (int)src - iVar48;
      uVar38 = UVar33 - local_138;
      pBVar28 = pBVar10;
      if (uVar38 < uVar19) {
        pBVar28 = pBVar12 + -uVar46;
      }
      if ((uVar38 - uVar19 < 0xfffffffd) && (*(int *)(pBVar28 + uVar38) == (int)*src)) {
        puVar53 = iEnd;
        if (uVar38 < uVar19) {
          puVar53 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar28 + uVar38) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar53,(BYTE *)iStart);
        if (src <= puVar23) {
          puVar53 = (ulong *)seqStore->lit;
          uVar36 = *(ulong *)((long)src + 8);
          *puVar53 = *src;
          puVar53[1] = uVar36;
        }
        psVar17 = seqStore->sequences;
        psVar17->litLength = 0;
        psVar17->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar17->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = psVar17 + 1;
        uVar36 = *src;
        pUVar14[uVar36 * -0x30e44323405a9d00 >> (bVar31 & 0x3f)] = UVar33;
        pUVar13[uVar36 * -0x30e44323485a9b9d >> (bVar30 & 0x3f)] = UVar33;
        src = (void *)((long)src + sVar26 + 4);
        bVar18 = true;
        UVar33 = local_134;
        local_134 = local_138;
      }
      else {
        bVar18 = false;
        UVar33 = local_138;
      }
      local_138 = UVar33;
      puVar53 = (ulong *)src;
    } while (bVar18);
  }
LAB_00603c50:
  if (puVar7 <= puVar53) goto LAB_006069a0;
  goto LAB_00603103;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}